

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

int cuddSymmSifting(DdManager *table,int lower,int upper)

{
  DdSubtable *pDVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  int *__ptr;
  void *__base;
  uint uVar9;
  uint *puVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  size_t __nmemb;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  timespec ts;
  timespec local_40;
  
  iVar8 = table->size;
  __nmemb = (size_t)iVar8;
  __ptr = (int *)malloc(__nmemb * 4);
  entry = __ptr;
  if (__ptr == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base != (void *)0x0) {
      if (0 < iVar8) {
        pDVar1 = table->subtables;
        piVar2 = table->perm;
        sVar11 = 0;
        do {
          __ptr[sVar11] = pDVar1[piVar2[sVar11]].keys;
          *(int *)((long)__base + sVar11 * 4) = (int)sVar11;
          sVar11 = sVar11 + 1;
        } while (__nmemb != sVar11);
      }
      qsort(__base,__nmemb,4,ddSymmUniqueCompare);
      auVar6 = _DAT_0094e250;
      auVar5 = _DAT_0094e240;
      uVar9 = upper - lower;
      if (lower <= upper) {
        auVar16._4_4_ = 0;
        auVar16._0_4_ = uVar9;
        auVar16._8_4_ = uVar9;
        auVar16._12_4_ = 0;
        puVar10 = &table->subtables[(long)lower + 1].next;
        uVar12 = 0;
        auVar16 = auVar16 ^ _DAT_0094e250;
        iVar14 = lower;
        do {
          auVar17._8_4_ = (int)uVar12;
          auVar17._0_8_ = uVar12;
          auVar17._12_4_ = (int)(uVar12 >> 0x20);
          auVar17 = (auVar17 | auVar5) ^ auVar6;
          if ((bool)(~(auVar17._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar17._0_4_ ||
                      auVar16._4_4_ < auVar17._4_4_) & 1)) {
            puVar10[-0xe] = iVar14;
          }
          if ((auVar17._12_4_ != auVar16._12_4_ || auVar17._8_4_ <= auVar16._8_4_) &&
              auVar17._12_4_ <= auVar16._12_4_) {
            *puVar10 = iVar14 + 1;
          }
          uVar12 = uVar12 + 2;
          iVar14 = iVar14 + 2;
          puVar10 = puVar10 + 0x1c;
        } while (((ulong)uVar9 + 2 & 0xfffffffffffffffe) != uVar12);
      }
      iVar14 = table->siftMaxVar;
      if (iVar8 < table->siftMaxVar) {
        iVar14 = iVar8;
      }
      if (0 < iVar14) {
        lVar15 = 0;
        do {
          if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
          if (table->TimeStop != 0) {
            iVar14 = clock_gettime(3,&local_40);
            if (iVar14 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
            }
            if (table->TimeStop < lVar13) break;
          }
          uVar9 = table->perm[*(int *)((long)__base + lVar15 * 4)];
          if ((((int)uVar9 <= upper && lower <= (int)uVar9) &&
              (table->subtables[(int)uVar9].next == uVar9)) &&
             (iVar14 = ddSymmSiftingAux(table,uVar9,lower,upper), iVar14 == 0)) {
            if (entry != (int *)0x0) {
              free(entry);
              entry = (int *)0x0;
            }
            free(__base);
            return 0;
          }
          lVar15 = lVar15 + 1;
          iVar14 = table->siftMaxVar;
          if (iVar8 < table->siftMaxVar) {
            iVar14 = iVar8;
          }
        } while (lVar15 < iVar14);
      }
      free(__base);
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
      if (lower <= upper) {
        iVar8 = 0;
        do {
          uVar9 = table->subtables[lower].next;
          uVar7 = lower;
          uVar4 = lower;
          while (uVar3 = uVar7, uVar9 != lower) {
            iVar8 = iVar8 + 1;
            uVar9 = table->subtables[(int)uVar3].next;
            uVar7 = uVar9;
            uVar4 = uVar3;
          }
          lower = uVar4 + 1;
        } while ((int)uVar4 < upper);
        return iVar8 + 1;
      }
      return 1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    free(__ptr);
    entry = (int *)0x0;
  }
  return 0;
}

Assistant:

int
cuddSymmSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
#ifdef DD_STATS
    int         previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,(size_t)size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself. */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        // enable timeout during variable reodering - alanmi 2/13/11
        if ( table->TimeStop && Abc_Clock() > table->TimeStop )
            break;
        x = table->perm[var[i]];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        if (x < lower || x > upper) continue;
        if (table->subtables[x].next == (unsigned) x) {
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+"); /* should never happen */
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    return(1+symvars);

ddSymmSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}